

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

reference __thiscall
pstore::sparse_array<int,_unsigned_int>::front(sparse_array<int,_unsigned_int> *this)

{
  uint uVar1;
  int *piVar2;
  indices local_c;
  
  local_c.bitmap_ = this->bitmap_;
  if (local_c.bitmap_ != 0) {
    uVar1 = indices::front(&local_c);
    piVar2 = sparse_array<int,unsigned_int>::index_impl<pstore::sparse_array<int,unsigned_int>&,int>
                       (this,(ulong)uVar1);
    return piVar2;
  }
  assert_failed("!empty ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                ,0x171);
}

Assistant:

constexpr bool empty () const noexcept { return bitmap_ == 0U; }